

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

BitcastType __thiscall
spirv_cross::CompilerHLSL::get_bitcast_type(CompilerHLSL *this,uint32_t result_type,uint32_t op0)

{
  BitcastType BVar1;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + result_type);
  pSVar3 = Compiler::expression_type((Compiler *)this,op0);
  if (((pSVar2->basetype != UInt64) || (pSVar3->basetype != UInt)) ||
     (BVar1 = TypePackUint2x32, pSVar3->vecsize != 2)) {
    BVar1 = (uint)(pSVar3->basetype == UInt64 && (pSVar2->vecsize == 2 && pSVar2->basetype == UInt))
            * 2;
  }
  return BVar1;
}

Assistant:

CompilerHLSL::BitcastType CompilerHLSL::get_bitcast_type(uint32_t result_type, uint32_t op0)
{
	auto &rslt_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);

	if (rslt_type.basetype == SPIRType::BaseType::UInt64 && expr_type.basetype == SPIRType::BaseType::UInt &&
	    expr_type.vecsize == 2)
		return BitcastType::TypePackUint2x32;
	else if (rslt_type.basetype == SPIRType::BaseType::UInt && rslt_type.vecsize == 2 &&
	         expr_type.basetype == SPIRType::BaseType::UInt64)
		return BitcastType::TypeUnpackUint64;

	return BitcastType::TypeNormal;
}